

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::NLProblemBuilder<StrictMockProblemBuilder>::OnHeader
          (NLProblemBuilder<StrictMockProblemBuilder> *this,NLHeader *h)

{
  int iVar1;
  NLProblemBuilder<StrictMockProblemBuilder> *in_RSI;
  MockProblemBuilder *in_RDI;
  int n_objs;
  int n;
  NLHeader *in_stack_00000028;
  NLProblemBuilder<StrictMockProblemBuilder> *in_stack_00000030;
  undefined4 in_stack_ffffffffffffffd8;
  Argument1 in_stack_ffffffffffffffdc;
  
  MockProblemBuilder::SetInfo
            (in_RDI,(Argument1)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  AddVariables(in_stack_00000030,in_stack_00000028);
  iVar1 = NLProblemInfo::num_common_exprs((NLProblemInfo *)in_RSI);
  if (iVar1 != 0) {
    MockProblemBuilder::AddCommonExprs(in_RDI,in_stack_ffffffffffffffdc);
  }
  iVar1 = resulting_nobj(in_RSI,iVar1);
  if (iVar1 != 0) {
    MockProblemBuilder::AddObjs(in_RDI,in_stack_ffffffffffffffdc);
  }
  if (*(int *)((long)&in_RSI->_vptr_NLProblemBuilder + 4) != 0) {
    MockProblemBuilder::AddAlgebraicCons(in_RDI,in_stack_ffffffffffffffdc);
  }
  if (*(int *)((long)&in_RSI[1]._vptr_NLProblemBuilder + 4) != 0) {
    MockProblemBuilder::AddLogicalCons(in_RDI,in_stack_ffffffffffffffdc);
  }
  if (*(int *)&in_RSI[6]._vptr_NLProblemBuilder != 0) {
    MockProblemBuilder::AddFunctions(in_RDI,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void OnHeader(const NLHeader &h) {
    builder_.SetInfo(h);

    // As nl-benchmark shows, adding problem components at once and then
    // updating them is faster than adding them incrementally. The latter
    // requires additional checks to make sure that problem components are
    // in the correct order.
    AddVariables(h);
    if (int n = h.num_common_exprs())
      builder_.AddCommonExprs(n);
    int n_objs = resulting_nobj( h.num_objs );
    if (n_objs != 0)
      builder_.AddObjs( n_objs );
    if (h.num_algebraic_cons != 0)
      builder_.AddAlgebraicCons(h.num_algebraic_cons);
    if (h.num_logical_cons != 0)
      builder_.AddLogicalCons(h.num_logical_cons);
    if (h.num_funcs != 0)
      builder_.AddFunctions(h.num_funcs);
  }